

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_revision.cpp
# Opt level: O0

void __thiscall RevisionsFixture_InitNothing_Test::TestBody(RevisionsFixture_InitNothing_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  maybe<unsigned_int,_void> local_3c;
  pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> local_34;
  undefined1 local_28 [8];
  revisions_type actual;
  revisions_type expected;
  RevisionsFixture_InitNothing_Test *this_local;
  
  anon_unknown.dwarf_5cb88::RevisionsFixture::expected_revisions
            ((revisions_type *)&actual.second,&this->super_RevisionsFixture,8,7);
  pstore::nothing<unsigned_int>();
  std::make_pair<unsigned_int_const&,pstore::maybe<unsigned_int,void>>
            (&local_34,&pstore::head_revision,&local_3c);
  pstore::diff_dump::update_revisions((revisions_type *)local_28,&local_34,8);
  std::pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_>::~pair(&local_34);
  pstore::maybe<unsigned_int,_void>::~maybe(&local_3c);
  testing::internal::EqHelper::
  Compare<std::pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_>,_std::pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_>,_nullptr>
            ((EqHelper *)local_60,"expected","actual",
             (pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> *)&actual.second,
             (pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> *)local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/diff/test_revision.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  std::pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_>::~pair
            ((pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> *)local_28);
  std::pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_>::~pair
            ((pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> *)&actual.second);
  return;
}

Assistant:

TEST_F (RevisionsFixture, InitNothing) {
    diff_dump::revisions_type const expected =
        this->expected_revisions (db_head_revision, db_head_revision - 1);
    diff_dump::revisions_type const actual = diff_dump::update_revisions (
        std::make_pair (head_revision, nothing<revision_number> ()), db_head_revision);

    EXPECT_EQ (expected, actual);
}